

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O0

bool discrete_check(int a,double *b)

{
  double dVar1;
  int local_24;
  int j;
  double b_sum;
  double *b_local;
  int a_local;
  
  local_24 = 0;
  while( true ) {
    if (a <= local_24) {
      dVar1 = r8vec_sum(a,b);
      if ((dVar1 != 0.0) || (NAN(dVar1))) {
        b_local._7_1_ = true;
      }
      else {
        std::operator<<((ostream *)&std::cerr," \n");
        std::operator<<((ostream *)&std::cerr,"DISCRETE_CHECK - Warning!\n");
        std::operator<<((ostream *)&std::cerr,"  Total probablity is zero.\n");
        b_local._7_1_ = false;
      }
      return b_local._7_1_;
    }
    if (b[local_24] <= 0.0 && b[local_24] != 0.0) break;
    local_24 = local_24 + 1;
  }
  std::operator<<((ostream *)&std::cerr," \n");
  std::operator<<((ostream *)&std::cerr,"DISCRETE_CHECK - Warning!\n");
  std::operator<<((ostream *)&std::cerr,"  Negative probabilities not allowed.\n");
  return false;
}

Assistant:

bool discrete_check ( int a, double b[] )

//****************************************************************************80
//
//  Purpose:
//
//    DISCRETE_CHECK checks the parameters of the Discrete CDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    15 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int A, the number of probabilities assigned.
//
//    Input, double B[A], the relative probabilities of
//    outcomes 1 through A.  Each entry must be nonnegative.
//
//    Output, bool DISCRETE_CHECK, is true if the parameters are legal.
//
{
  double b_sum;
  int j;

  for ( j = 0; j < a; j++ )
  {
    if ( b[j] < 0.0 )
    {
      cerr << " \n";
      cerr << "DISCRETE_CHECK - Warning!\n";
      cerr << "  Negative probabilities not allowed.\n";
      return false;
    }
  }

  b_sum = r8vec_sum ( a, b );

  if ( b_sum == 0.0 )
  {
    cerr << " \n";
    cerr << "DISCRETE_CHECK - Warning!\n";
    cerr << "  Total probablity is zero.\n";
    return false;
  }

  return true;
}